

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char **ppcVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *pcVar5;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char **ptr_00;
  byte *pbVar6;
  unsigned_short *in_R8;
  char **ppcStack_50;
  int tok;
  
  if (ptr == end) {
    return -1;
  }
  cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  if (cVar2 == '\x05') {
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
    if (iVar3 != 0) {
      ptr_00 = (char **)(ptr + 2);
      pcVar5 = extraout_RDX_04;
      goto LAB_00154a59;
    }
  }
  else if (cVar2 == '\x06') {
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[0])(enc,ptr,end,nextTokPtr);
    if (iVar3 != 0) {
      ptr_00 = (char **)(ptr + 3);
      pcVar5 = extraout_RDX_03;
      goto LAB_00154a59;
    }
  }
  else if (cVar2 == '\a') {
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[1])(enc,ptr,end,nextTokPtr);
    if (iVar3 != 0) {
      ptr_00 = (char **)(ptr + 4);
      pcVar5 = extraout_RDX_02;
      goto LAB_00154a59;
    }
  }
  else if ((cVar2 == '\x16') || (cVar2 == '\x18')) {
    ptr_00 = (char **)(ptr + 1);
    pcVar5 = end;
LAB_00154a59:
    ppcVar4 = (char **)0x1;
    do {
      if (ptr_00 == (char **)end) {
        return -1;
      }
      ppcStack_50 = ppcVar4;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ptr_00)) {
      case 5:
        if ((long)end - (long)ptr_00 < 2) {
          return -2;
        }
        iVar3 = (*enc[2].isPublicId)(enc,(char *)ptr_00,pcVar5,(char **)0x1);
        ppcStack_50 = (char **)0x2;
        pcVar5 = extraout_RDX;
        break;
      case 6:
        if ((long)end - (long)ptr_00 < 3) {
          return -2;
        }
        iVar3 = (*enc[2].utf8Convert)(enc,ptr_00,pcVar5,(char **)0x1,(char *)in_R8);
        ppcStack_50 = (char **)0x3;
        pcVar5 = extraout_RDX_01;
        break;
      case 7:
        if ((long)end - (long)ptr_00 < 4) {
          return -2;
        }
        iVar3 = (*enc[2].utf16Convert)(enc,ptr_00,pcVar5,(unsigned_short **)0x1,in_R8);
        ppcStack_50 = (char **)0x4;
        pcVar5 = extraout_RDX_00;
        break;
      default:
        ppcVar4 = ptr_00;
LAB_00154cad:
        *nextTokPtr = (char *)ppcVar4;
        return 0;
      case 9:
      case 10:
      case 0x15:
        iVar3 = normal_checkPiTarget((ENCODING *)ptr,(char *)ptr_00,(char *)&tok,(int *)0x1);
        if (iVar3 == 0) goto switchD_00154a90_caseD_1d;
        pcVar5 = extraout_RDX_05;
        pbVar1 = (byte *)((long)ptr_00 + 1);
        goto LAB_00154bcf;
      case 0xf:
        iVar3 = normal_checkPiTarget((ENCODING *)ptr,(char *)ptr_00,(char *)&tok,(int *)0x1);
        if (iVar3 != 0) {
          ppcVar4 = (char **)((long)ptr_00 + 1);
          if (ppcVar4 == (char **)end) {
            return -1;
          }
          if (*(char *)ppcVar4 == '>') {
            *nextTokPtr = (char *)((long)ptr_00 + 2);
            return tok;
          }
          goto LAB_00154cad;
        }
        goto switchD_00154a90_caseD_1d;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00154a90_caseD_16;
      case 0x1d:
        goto switchD_00154a90_caseD_1d;
      }
      if (iVar3 == 0) {
switchD_00154a90_caseD_1d:
        *nextTokPtr = (char *)ptr_00;
        return 0;
      }
switchD_00154a90_caseD_16:
      ptr_00 = (char **)((long)ptr_00 + (long)ppcStack_50);
    } while( true );
  }
  *nextTokPtr = ptr;
  return 0;
switchD_00154bf5_caseD_f:
  pbVar1 = pbVar6 + 1;
  if (pbVar1 == (byte *)end) {
    return -1;
  }
  if (*pbVar1 == 0x3e) {
    *nextTokPtr = (char *)(pbVar6 + 2);
    return tok;
  }
LAB_00154bcf:
  pbVar6 = pbVar1;
  if (pbVar6 == (byte *)end) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar6)) {
  case 0:
  case 1:
  case 8:
    break;
  default:
    pbVar1 = pbVar6 + 1;
    goto LAB_00154bcf;
  case 5:
    if ((long)end - (long)pbVar6 < 2) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[2])(enc,(char *)pbVar6,pcVar5,ppcVar4);
    if (iVar3 == 0) {
      pcVar5 = extraout_RDX_06;
      pbVar1 = pbVar6 + 2;
      goto LAB_00154bcf;
    }
    break;
  case 6:
    if ((long)end - (long)pbVar6 < 3) {
      return -2;
    }
    iVar3 = (*enc[3].scanners[3])(enc,(char *)pbVar6,pcVar5,ppcVar4);
    if (iVar3 == 0) {
      pcVar5 = extraout_RDX_07;
      pbVar1 = pbVar6 + 3;
      goto LAB_00154bcf;
    }
    break;
  case 7:
    if ((long)end - (long)pbVar6 < 4) {
      return -2;
    }
    iVar3 = (*enc[3].literalScanners[0])(enc,(char *)pbVar6,pcVar5,ppcVar4);
    if (iVar3 == 0) {
      pcVar5 = extraout_RDX_08;
      pbVar1 = pbVar6 + 4;
      goto LAB_00154bcf;
    }
    break;
  case 0xf:
    goto switchD_00154bf5_caseD_f;
  }
  *nextTokPtr = (char *)pbVar6;
  return 0;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}